

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdlib.c
# Opt level: O0

CrispyValue std_str(CrispyValue *value,Vm *vm)

{
  ObjDict *dict;
  size_t sVar1;
  char *__s;
  CrispyValue CVar2;
  ObjDict *local_90;
  char *dict_string;
  Object *object;
  char s [23];
  ObjString *string;
  Vm *vm_local;
  CrispyValue *value_local;
  
  stack0xffffffffffffffd0 = (ObjDict *)0x0;
  switch(value->type) {
  case NIL:
    register0x00000000 = (ObjDict *)new_string(vm,"nil",3);
    break;
  case NUMBER:
    snprintf((char *)&object,0x17,"%.15g",(value->field_1).d_value);
    sVar1 = strlen((char *)&object);
    register0x00000000 = (ObjDict *)new_string(vm,(char *)&object,sVar1);
    break;
  case OBJECT:
    dict = (ObjDict *)(value->field_1).o_value;
    switch((dict->object).type) {
    case OBJ_STRING:
      unique0x100001e8 = dict;
      break;
    case OBJ_LAMBDA:
      register0x00000000 = (ObjDict *)new_string(vm,"<function>",10);
      break;
    case OBJ_NATIVE_FUNC:
      register0x00000000 = (ObjDict *)new_string(vm,"<native function>",0x11);
      break;
    case OBJ_DICT:
      __s = dict_to_string(dict);
      sVar1 = strlen(__s);
      register0x00000000 = (ObjDict *)new_string(vm,__s,sVar1);
      free(__s);
      break;
    case OBJ_LIST:
      register0x00000000 = (ObjDict *)new_string(vm,"<list>",6);
    }
    break;
  case BOOLEAN:
    if ((value->field_1).p_value == 0) {
      local_90 = (ObjDict *)new_string(vm,"false",5);
    }
    else {
      local_90 = (ObjDict *)new_string(vm,"true",4);
    }
    stack0xffffffffffffffd0 = local_90;
  }
  CVar2 = create_object(&stack0xffffffffffffffd0->object);
  CVar2._4_4_ = 0;
  return CVar2;
}

Assistant:

CrispyValue std_str(CrispyValue *value, Vm *vm) {
    ObjString *string = NULL;

    switch (value->type) {
        case NUMBER: {
            char s[23];
            snprintf(s, 23, "%.15g", value->d_value);
            // crispy strings are not null terminated
            string = new_string(vm, s, strlen(s));
            break;
        }
        case OBJECT: {
            Object *object = value->o_value;

            switch (object->type) {
                case OBJ_STRING:
                    string = (ObjString *) object;
                    break;
                case OBJ_LAMBDA:
                    // TODO arity
                    string = new_string(vm, "<function>", 10);
                    break;
                case OBJ_NATIVE_FUNC:
                    // TODO arity
                    string = new_string(vm, "<native function>", 17);
                    break;
                case OBJ_DICT: {
                    char *dict_string = dict_to_string((ObjDict *) object);
                    string = new_string(vm, dict_string, strlen(dict_string));
                    free(dict_string);
                    break;
                }
                case OBJ_LIST:
                    string = new_string(vm, "<list>", 6);
                    break;
            }
            break;
        }
        case BOOLEAN: {
            string = value->p_value ? new_string(vm, "true", 4) : new_string(vm, "false", 5);
            break;
        }
        case NIL:
            string = new_string(vm, "nil", 3);
            break;
    }

    return create_object((Object *) string);
}